

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

ByteArray *
ot::commissioner::CommissionerImpl::GetBbrDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  type local_26;
  type local_25 [17];
  type local_14 [2];
  ushort local_12;
  ByteArray *pBStack_10;
  uint16_t aDatasetFlags_local;
  ByteArray *tlvTypes;
  
  local_14[1] = 0;
  local_12 = aDatasetFlags;
  pBStack_10 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if ((local_12 & 0x8000) != 0) {
    local_14[0] = utils::to_underlying<ot::commissioner::tlv::Type>(kTriHostname);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_14);
  }
  if ((local_12 & 0x4000) != 0) {
    local_25[0] = utils::to_underlying<ot::commissioner::tlv::Type>(kRegistrarHostname);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,local_25);
  }
  if ((local_12 & 0x2000) != 0) {
    local_26 = utils::to_underlying<ot::commissioner::tlv::Type>(kRegistrarIpv6Address);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetBbrDatasetTlvs(uint16_t aDatasetFlags)
{
    ByteArray tlvTypes;

    if (aDatasetFlags & BbrDataset::kTriHostnameBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kTriHostname));
    }

    if (aDatasetFlags & BbrDataset::kRegistrarHostnameBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kRegistrarHostname));
    }

    if (aDatasetFlags & BbrDataset::kRegistrarIpv6AddrBit)
    {
        tlvTypes.emplace_back(utils::to_underlying(tlv::Type::kRegistrarIpv6Address));
    }
    return tlvTypes;
}